

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O0

Violation __thiscall
mp::SOS_1or2_Constraint<1>::
ComputeViolationSOS1<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (SOS_1or2_Constraint<1> *this,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  Violation VVar1;
  size_type sVar2;
  int *piVar3;
  long in_RDI;
  int i;
  int nnz;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_28;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
  local_28 = (int)sVar2;
  while (local_28 != 0) {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)(local_28 + -1));
    VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::is_nonzero
              ((VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (int)((ulong)in_RDI >> 0x20));
    local_28 = local_28 + -1;
  }
  piVar3 = std::max<int>((int *)&stack0xffffffffffffffd4,(int *)&stack0xffffffffffffffd0);
  VVar1.valX_ = 0.0;
  VVar1.viol_ = (double)*piVar3;
  return VVar1;
}

Assistant:

Violation ComputeViolationSOS1(const VarInfo& x) const {
    int nnz=0;
    for (int i=(int)v_.size(); i--; ) {
      if (x.is_nonzero(v_[i]))
        ++nnz;
    }
    return {(double)std::max(0, nnz-1), 0.0};
  }